

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.cpp
# Opt level: O0

int __thiscall P_Assertion::match(P_Assertion *this,vector<StateP,_std::allocator<StateP>_> *stk)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  State local_70;
  vector<StateP,_std::allocator<StateP>_> *local_18;
  vector<StateP,_std::allocator<StateP>_> *stk_local;
  P_Assertion *this_local;
  
  local_18 = stk;
  stk_local = (vector<StateP,_std::allocator<StateP>_> *)this;
  pvVar3 = std::vector<StateP,_std::allocator<StateP>_>::back(stk);
  State::State(&local_70,&pvVar3->st);
  uVar2 = ::match(&local_70,this->pattern,false);
  bVar1 = this->value;
  State::~State(&local_70);
  if (uVar2 == (bVar1 & 1)) {
    pvVar3 = std::vector<StateP,_std::allocator<StateP>_>::back(local_18);
    pvVar3->iseq = pvVar3->iseq + 1;
  }
  else {
    std::vector<StateP,_std::allocator<StateP>_>::pop_back(local_18);
  }
  return 0;
}

Assistant:

int P_Assertion::match(vector<StateP> &stk) {
    if ((int) ::match(stk.back().st, pattern) == (int) value) {
        stk.back().iseq++;
    } else {
        stk.pop_back();
    }
    return 0;
}